

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void update_monster_region(monst *mon)

{
  region *reg;
  boolean bVar1;
  boolean bVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 < mon->dlevel->n_regions; lVar3 = lVar3 + 1) {
    reg = mon->dlevel->regions[lVar3];
    bVar1 = inside_region(reg,(int)mon->mx,(int)mon->my);
    bVar2 = mon_in_region(reg,mon);
    if (bVar1 == '\0') {
      if (bVar2 != '\0') {
        remove_mon_from_reg(reg,mon);
      }
    }
    else if (bVar2 == '\0') {
      add_mon_to_reg(reg,mon);
    }
  }
  return;
}

Assistant:

void update_monster_region(struct monst *mon)
{
    int i;

    for (i = 0; i < mon->dlevel->n_regions; i++) {
	if (inside_region(mon->dlevel->regions[i], mon->mx, mon->my)) {
	    if (!mon_in_region(mon->dlevel->regions[i], mon))
		add_mon_to_reg(mon->dlevel->regions[i], mon);
	} else {
	    if (mon_in_region(mon->dlevel->regions[i], mon))
		remove_mon_from_reg(mon->dlevel->regions[i], mon);
	}
    }
}